

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

int phred_sum(string *phred,char phred_base)

{
  int iVar1;
  undefined3 in_register_00000031;
  size_type sVar2;
  
  iVar1 = 0;
  for (sVar2 = 0; phred->_M_string_length != sVar2; sVar2 = sVar2 + 1) {
    iVar1 = (iVar1 - CONCAT31(in_register_00000031,phred_base)) +
            (int)(phred->_M_dataplus)._M_p[sVar2];
  }
  return iVar1;
}

Assistant:

int phred_sum(const string& phred, char phred_base=33) {
    int result = 0;
    for (size_t i=0; i<phred.size(); ++i) {
        result += phred[i] - phred_base;
    }
    return result;
}